

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# semver.hpp
# Opt level: O0

size_t semver::detail::length<int>(int n)

{
  undefined8 local_18;
  size_t digits;
  int n_local;
  
  local_18 = 0;
  digits._4_4_ = n;
  do {
    local_18 = local_18 + 1;
    digits._4_4_ = digits._4_4_ / 10;
  } while (digits._4_4_ != 0);
  return local_18;
}

Assistant:

SEMVER_CONSTEXPR std::size_t length(Int n) noexcept {
      std::size_t digits = 0;
      do {
        digits++;
        n /= 10;
      } while (n != 0);
      return digits;
    }